

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O2

void __thiscall
cppcms::impl::response_headers::
format_http_headers<cppcms::impl::response_headers::string_buffer_wrapper>
          (response_headers *this,string_buffer_wrapper *io,char *http_version,bool complete)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  undefined3 in_register_00000009;
  _List_node_base *p_Var5;
  allocator local_55;
  undefined4 local_54;
  key_type local_50;
  
  std::__cxx11::string::append((char *)io);
  std::__cxx11::string::append((char *)io);
  std::__cxx11::string::append((char *)io);
  std::__cxx11::string::string((string *)&local_50,"Status",&local_55);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
  local_54 = CONCAT31(in_register_00000009,complete);
  if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
    std::__cxx11::string::append((char *)io);
  }
  else {
    std::__cxx11::string::append((string *)io);
  }
  std::__cxx11::string::append((char *)io);
  for (p_Var4 = (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar2 = local_54, (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4 != cVar3._M_node) {
      std::__cxx11::string::append((string *)io);
      std::__cxx11::string::append((char *)io);
      std::__cxx11::string::append((string *)io);
      std::__cxx11::string::append((char *)io);
    }
  }
  p_Var5 = (_List_node_base *)&this->added_headers_;
  while (p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->added_headers_) {
    std::__cxx11::string::append((string *)io);
    std::__cxx11::string::append((char *)io);
  }
  if ((char)uVar2 != '\0') {
    std::__cxx11::string::append((char *)io);
  }
  return;
}

Assistant:

void format_http_headers(IODevice &io,char const *http_version,bool complete) const
	{
		io << "HTTP/" << http_version << " ";;
		auto status_ptr = headers_.find("Status");
		if(status_ptr == headers_.end()) {
			io << "200 Ok";
		}
		else {
			io << status_ptr->second;
		}
		io << "\r\n";
		for(auto p=std::begin(headers_),e=std::end(headers_);p!=e;++p) {
			if(p!=status_ptr)
				io << p->first << ": " << p->second << "\r\n";
		}
		for(auto const &h: added_headers_) {
			io <<  h << "\r\n" ;
		}
		if(complete)
			io << "\r\n";
	}